

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk_file_transfer.cpp
# Opt level: O1

TonkFile tonk_file_from_buffer
                   (TonkConnection connection,uint32_t channel,char *name,void *data,uint32_t bytes,
                   uint32_t flags)

{
  undefined1 uVar1;
  TonkFile pTVar2;
  char *pcVar3;
  ulong __n;
  
  if (data == (void *)0x0 || (name == (char *)0x0 || connection == (TonkConnection)0x0)) {
    return (TonkFile)0x0;
  }
  pTVar2 = (TonkFile)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  if (pTVar2 == (TonkFile)0x0) {
    pTVar2 = (TonkFile)0x0;
  }
  else {
    pTVar2->ProgressBytes = 0;
    pTVar2->TotalBytes = 0;
    pTVar2->Flags = 0;
    pTVar2->Name = (char *)0x0;
    pTVar2->OutputData = (uint8_t *)0x0;
    pTVar2->OutputFileName = (char *)0x0;
    pTVar2[1].ProgressBytes = (uint64_t)&pTVar2[1].Flags;
    pTVar2[1].TotalBytes = 0;
    *(undefined1 *)&pTVar2[1].Flags = 0;
    cat::MappedFile::MappedFile((MappedFile *)&pTVar2[1].OutputData);
    cat::MappedView::MappedView((MappedView *)(pTVar2 + 2));
    *(undefined4 *)&pTVar2[2].OutputFileName = 0;
    *(undefined1 *)((long)&pTVar2[2].OutputFileName + 4) = 0;
    *(undefined4 *)&pTVar2[3].ProgressBytes = 0;
    pTVar2[3].TotalBytes = (uint64_t)&pTVar2[3].Name;
    *(undefined8 *)&pTVar2[3].Flags = 0;
    *(undefined1 *)&pTVar2[3].Name = 0;
    pTVar2[3].OutputFileName = (char *)0x0;
    pTVar2[4].ProgressBytes = 0;
    *(undefined8 *)((long)&pTVar2[4].ProgressBytes + 5) = 0;
    *(undefined8 *)((long)&pTVar2[4].TotalBytes + 5) = 0;
  }
  if (pTVar2 == (TonkFile)0x0) {
    return (TonkFile)0x0;
  }
  pTVar2[4].Flags = channel;
  if (channel - 0x32 < 6) {
    uVar1 = 0;
  }
  else {
    uVar1 = 1;
    if (5 < channel - 0x96) goto LAB_0013336d;
  }
  pTVar2[4].field_0x14 = uVar1;
  pTVar2[4].TotalBytes = (uint64_t)connection;
  pcVar3 = (char *)pTVar2[1].TotalBytes;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)(pTVar2 + 1),0,pcVar3,(ulong)name);
  pTVar2->Name = (char *)pTVar2[1].ProgressBytes;
  __n = (ulong)bytes;
  pcVar3 = (char *)data;
  if ((flags & 1) == 0) {
    pcVar3 = (char *)operator_new__(__n,(nothrow_t *)&std::nothrow);
    pTVar2[4].ProgressBytes = (uint64_t)pcVar3;
    if (pcVar3 == (char *)0x0) {
LAB_0013336d:
      if ((char **)pTVar2[3].TotalBytes != &pTVar2[3].Name) {
        operator_delete((undefined1 *)pTVar2[3].TotalBytes);
      }
      cat::MappedView::~MappedView((MappedView *)(pTVar2 + 2));
      cat::MappedFile::~MappedFile((MappedFile *)&pTVar2[1].OutputData);
      if ((uint32_t *)pTVar2[1].ProgressBytes != &pTVar2[1].Flags) {
        operator_delete((undefined1 *)pTVar2[1].ProgressBytes);
      }
      operator_delete(pTVar2);
      return (TonkFile)0x0;
    }
    memcpy(pcVar3,data,__n);
  }
  pTVar2[3].OutputFileName = pcVar3;
  pTVar2->TotalBytes = __n;
  return pTVar2;
}

Assistant:

TONK_EXPORT TonkFile tonk_file_from_buffer(
    TonkConnection connection,  ///< Connection to send on
    uint32_t          channel,  ///< Reliable channel for data
    const char*          name,  ///< Transfer name
    const void*          data,  ///< File buffer data pointer
    uint32_t            bytes,  ///< File buffer bytes to send
    uint32_t            flags   ///< Flags for buffer
)
{
    // Input validation
    if (!connection || !name || !data) {
        TONK_DEBUG_BREAK();
        return nullptr;
    }

    TonkFileTransfer* transfer = new (std::nothrow) TonkFileTransfer;

    if (!transfer) {
        return nullptr; // OOM
    }

    // Input validation
    if (!transfer->SetChannel(channel)) {
        delete transfer;
        return nullptr;
    }

    transfer->Connection = connection;
    transfer->NameStr = name;
    transfer->Name = transfer->NameStr.c_str();

    if (flags & TONK_FILE_BUFFER_ZERO_COPY) {
        transfer->AppDataPtr = reinterpret_cast<const uint8_t*>(data);
    }
    else {
        transfer->InternalDataCopy = new (std::nothrow) uint8_t[bytes];

        if (!transfer->InternalDataCopy) {
            delete transfer;
            return nullptr; // OOM
        }

        // Make a copy of the app data
        memcpy(transfer->InternalDataCopy, data, bytes);
        transfer->AppDataPtr = transfer->InternalDataCopy;
    }
    transfer->TotalBytes = bytes;

    return reinterpret_cast<TonkFile>(transfer);
}